

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_pipe_stop(void *arg)

{
  long lVar1;
  udp_ep *ep;
  udp_pipe *p;
  void *arg_local;
  
  lVar1 = *arg;
  udp_pipe_close(arg);
  nni_mtx_lock((nni_mtx *)(lVar1 + 8));
  if (*(int *)((long)arg + 0x9c) != 0) {
    nni_id_remove((nni_id_map *)(*arg + 0x820),(ulong)*(uint *)((long)arg + 0x9c));
    *(undefined4 *)((long)arg + 0x9c) = 0;
  }
  nni_list_node_remove((nni_list_node *)((long)arg + 0xd0));
  nni_mtx_unlock((nni_mtx *)(lVar1 + 8));
  return;
}

Assistant:

static void
udp_pipe_stop(void *arg)
{
	udp_pipe *p  = arg;
	udp_ep   *ep = p->ep;

	udp_pipe_close(arg);

	nni_mtx_lock(&ep->mtx);
	if (p->self_id != 0) {
		nni_id_remove(&p->ep->pipes, p->self_id);
		p->self_id = 0;
	}
	nni_list_node_remove(&p->node);
	nni_mtx_unlock(&ep->mtx);
}